

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa-verify.c
# Opt level: O0

int dsa_verify_hash(uint8_t *sha1,char *pubkey,char *sig)

{
  size_t len;
  uchar *out;
  void *__ptr;
  uchar *out_00;
  size_t sVar1;
  char *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  uchar *sig_der;
  uchar *key_der;
  int ret;
  size_t sig_len;
  size_t key_len;
  SHA1_t sha1sum;
  uchar *in_stack_00000068;
  uint8_t *in_stack_00000070;
  int local_4c;
  char *in_stack_ffffffffffffffc8;
  
  SHA1(&stack0xffffffffffffffc8,in_RDI,(uchar *)0x14);
  len = strlen(in_RSI);
  out = (uchar *)strlen(in_RDX);
  __ptr = malloc((ulong)(uint)((int)(len >> 2) * 3));
  out_00 = (uchar *)malloc((ulong)(uint)((int)((ulong)out >> 2) * 3));
  sVar1 = pem2der(in_stack_ffffffffffffffc8,len,out);
  if (sVar1 == 0) {
    local_4c = -2;
  }
  else {
    sVar1 = base64_decode(in_RDX,(size_t)out,out_00);
    if (sVar1 == 0) {
      local_4c = -4;
    }
    else {
      local_4c = dsa_verify_hash_der(in_stack_00000070,in_stack_00000068,(size_t)sha1,
                                     (uchar *)pubkey,(size_t)sig);
    }
  }
  free(__ptr);
  free(out_00);
  return local_4c;
}

Assistant:

int dsa_verify_hash(const SHA1_t sha1, const char* pubkey, const char* sig)
{
	SHA1_t sha1sum;
	SHA1(sha1sum, (const unsigned char*)sha1, sizeof(SHA1_t));

	size_t key_len = strlen(pubkey);
	size_t sig_len = strlen(sig);

	int ret;
	unsigned char* key_der = malloc(BASE64_DECODE_OUT_SIZE(key_len));
	unsigned char* sig_der = malloc(BASE64_DECODE_OUT_SIZE(sig_len));

	if((key_len = pem2der(pubkey, key_len, key_der)) == 0)
	{
		ret = DSA_KEY_FORMAT_ERROR;
		goto error;
	}

	if((sig_len = base64_decode(sig, sig_len, sig_der)) == 0)
	{
		ret = DSA_SIGNATURE_FORMAT_ERROR;
		goto error;
	}

	ret = dsa_verify_hash_der(sha1sum, key_der, key_len, sig_der, sig_len);

error:
	free(key_der);
	free(sig_der);

	return ret;
}